

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

filtration_entry_t __thiscall
priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::pop_pivot(priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            *this)

{
  pointer pfVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  __hash_code __code;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  _Node_iterator_base<std::pair<const_long,_bool>,_false> _Var6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  __hash_code __code_1;
  _Hash_node_base *p_Var9;
  filtration_entry_t fVar10;
  float local_1c;
  
  remove_trivial_coefficient_entries(this);
  pfVar1 = (this->
           super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
           ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 == (this->
                super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
LAB_0012071d:
    local_1c = 0.0;
    p_Var9 = (_Hash_node_base *)0xffffffffffffffff;
  }
  else {
    local_1c = (pfVar1->super_pair<float,_long>).first;
    p_Var9 = (_Hash_node_base *)(pfVar1->super_pair<float,_long>).second;
    if (this->use_dense_version == true) {
      uVar2 = (this->coefficients)._M_h._M_bucket_count;
      uVar5 = (ulong)p_Var9 % uVar2;
      p_Var7 = (this->coefficients)._M_h._M_buckets[uVar5];
      p_Var3 = (__node_base_ptr)0x0;
      if ((p_Var7 != (__node_base_ptr)0x0) &&
         (p_Var4 = p_Var7->_M_nxt, p_Var3 = p_Var7, p_Var9 != p_Var7->_M_nxt[1]._M_nxt)) {
        while (p_Var7 = p_Var4, p_Var4 = p_Var7->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var3 = (__node_base_ptr)0x0;
          if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar5) ||
             (p_Var3 = p_Var7, p_Var9 == p_Var4[1]._M_nxt)) goto LAB_001205a0;
        }
        p_Var3 = (__node_base_ptr)0x0;
      }
LAB_001205a0:
      if (p_Var3 == (__node_base_ptr)0x0) {
        _Var6._M_cur = (__node_type *)0x0;
      }
      else {
        _Var6._M_cur = (__node_type *)p_Var3->_M_nxt;
      }
      if (_Var6._M_cur != (__node_type *)0x0) {
        std::
        _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&(this->coefficients)._M_h,(const_iterator)_Var6._M_cur);
      }
    }
    std::
    priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
    ::pop(&this->
           super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
         );
    pfVar1 = (this->
             super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((pfVar1 != (this->
                   super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish) &&
       (p_Var4 = (_Hash_node_base *)(pfVar1->super_pair<float,_long>).second, p_Var4 == p_Var9)) {
      do {
        if (this->use_dense_version == true) {
          uVar2 = (this->coefficients)._M_h._M_bucket_count;
          uVar5 = (ulong)p_Var4 % uVar2;
          p_Var7 = (this->coefficients)._M_h._M_buckets[uVar5];
          p_Var3 = (__node_base_ptr)0x0;
          if ((p_Var7 != (__node_base_ptr)0x0) &&
             (p_Var3 = p_Var7, p_Var8 = p_Var7->_M_nxt, p_Var4 != p_Var7->_M_nxt[1]._M_nxt)) {
            while (p_Var9 = p_Var8->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
              p_Var3 = (__node_base_ptr)0x0;
              if (((ulong)p_Var9[1]._M_nxt % uVar2 != uVar5) ||
                 (p_Var3 = p_Var8, p_Var8 = p_Var9, p_Var4 == p_Var9[1]._M_nxt)) goto LAB_00120640;
            }
            p_Var3 = (__node_base_ptr)0x0;
          }
LAB_00120640:
          if (p_Var3 == (__node_base_ptr)0x0) {
            _Var6._M_cur = (__node_type *)0x0;
          }
          else {
            _Var6._M_cur = (__node_type *)p_Var3->_M_nxt;
          }
          if (_Var6._M_cur != (__node_type *)0x0) {
            std::
            _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&(this->coefficients)._M_h,(const_iterator)_Var6._M_cur);
          }
        }
        std::
        priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ::pop(&this->
               super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             );
        remove_trivial_coefficient_entries(this);
        pfVar1 = (this->
                 super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                 ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pfVar1 == (this->
                      super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                      ).c.
                      super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish) goto LAB_0012071d;
        local_1c = (pfVar1->super_pair<float,_long>).first;
        p_Var9 = (_Hash_node_base *)(pfVar1->super_pair<float,_long>).second;
        if (this->use_dense_version == true) {
          uVar2 = (this->coefficients)._M_h._M_bucket_count;
          uVar5 = (ulong)p_Var9 % uVar2;
          p_Var7 = (this->coefficients)._M_h._M_buckets[uVar5];
          p_Var3 = (__node_base_ptr)0x0;
          if ((p_Var7 != (__node_base_ptr)0x0) &&
             (p_Var3 = p_Var7, p_Var8 = p_Var7->_M_nxt, p_Var9 != p_Var7->_M_nxt[1]._M_nxt)) {
            while (p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
              p_Var3 = (__node_base_ptr)0x0;
              if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar5) ||
                 (p_Var3 = p_Var8, p_Var8 = p_Var4, p_Var9 == p_Var4[1]._M_nxt)) goto LAB_001206e4;
            }
            p_Var3 = (__node_base_ptr)0x0;
          }
LAB_001206e4:
          if (p_Var3 == (__node_base_ptr)0x0) {
            _Var6._M_cur = (__node_type *)0x0;
          }
          else {
            _Var6._M_cur = (__node_type *)p_Var3->_M_nxt;
          }
          if (_Var6._M_cur != (__node_type *)0x0) {
            std::
            _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&(this->coefficients)._M_h,(const_iterator)_Var6._M_cur);
          }
        }
        std::
        priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ::pop(&this->
               super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             );
        pfVar1 = (this->
                 super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                 ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while ((pfVar1 != (this->
                          super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                          ).c.
                          super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish) &&
              (p_Var4 = (_Hash_node_base *)(pfVar1->super_pair<float,_long>).second,
              p_Var4 == p_Var9));
    }
  }
  fVar10.super_pair<float,_long>._4_4_ = 0;
  fVar10.super_pair<float,_long>.first = local_1c;
  fVar10.super_pair<float,_long>.second = (long)p_Var9;
  return (filtration_entry_t)fVar10.super_pair<float,_long>;
}

Assistant:

filtration_entry_t pop_pivot() {
		remove_trivial_coefficient_entries();
		if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
			return filtration_entry_t(-1);
		else {
			auto pivot = get_top();
			safe_pop();
			while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			       get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()) ==
			           get_index(pivot)) {
				safe_pop();
				remove_trivial_coefficient_entries();

				if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
					return filtration_entry_t(-1);
				else {
					pivot = get_top();
					safe_pop();
				}
			}
			return pivot;
		}
	}